

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clauseAnd(SelectionCompiler *this)

{
  bool bVar1;
  int iVar2;
  SelectionCompiler *in_RDI;
  Token tokenAnd;
  undefined7 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  SelectionCompiler *in_stack_ffffffffffffffd8;
  SelectionCompiler *in_stack_ffffffffffffffe8;
  byte local_1;
  
  bVar1 = clauseNot(in_stack_ffffffffffffffe8);
  if (bVar1) {
    while (iVar2 = tokPeek((SelectionCompiler *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
          iVar2 == 0x403) {
      tokenNext(in_stack_ffffffffffffffd8);
      bVar1 = clauseNot(in_stack_ffffffffffffffe8);
      if (bVar1) {
        addTokenToPostfix(in_RDI,(Token *)CONCAT17(bVar1,in_stack_ffffffffffffffb8));
      }
      else {
        local_1 = 0;
      }
      uVar3 = (uint)!bVar1;
      Token::~Token((Token *)0x3b6b12);
      if (uVar3 != 0) goto LAB_003b6b28;
      in_stack_ffffffffffffffc8 = 0;
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_003b6b28:
  return (bool)(local_1 & 1);
}

Assistant:

bool SelectionCompiler::clauseAnd() {
    if (!clauseNot()) { return false; }

    while (tokPeek() == Token::opAnd) {
      Token tokenAnd = tokenNext();
      if (!clauseNot()) { return false; }
      addTokenToPostfix(tokenAnd);
    }
    return true;
  }